

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

MemorySize * __thiscall wasm::Builder::makeMemorySize(Builder *this,Name memoryName,MemoryInfo info)

{
  MemorySize *this_00;
  Memory *pMVar1;
  
  this_00 = (MemorySize *)MixedArena::allocSpace(&this->wasm->allocator,0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)20>).super_Expression._id = MemorySizeId;
  (this_00->ptrType).id = 2;
  (this_00->memory).super_IString.str._M_len = 0;
  (this_00->memory).super_IString.str._M_str = (char *)0x0;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)20>).super_Expression.type.id = 2;
  if (info != Memory64) {
    if (info != Unspecified) goto LAB_005cc6aa;
    pMVar1 = Module::getMemory(this->wasm,memoryName);
    if ((pMVar1->indexType).id != 3) goto LAB_005cc6aa;
  }
  MemorySize::make64(this_00);
LAB_005cc6aa:
  (this_00->memory).super_IString.str._M_len = memoryName.super_IString.str._M_len;
  (this_00->memory).super_IString.str._M_str = memoryName.super_IString.str._M_str;
  MemorySize::finalize(this_00);
  return this_00;
}

Assistant:

MemorySize* makeMemorySize(Name memoryName,
                             MemoryInfo info = MemoryInfo::Unspecified) {
    auto* ret = wasm.allocator.alloc<MemorySize>();
    if (isMemory64(memoryName, info)) {
      ret->make64();
    }
    ret->memory = memoryName;
    ret->finalize();
    return ret;
  }